

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_FreeContext(JSContext *ctx)

{
  int iVar1;
  JSRuntime *pJVar2;
  JSValue *pJVar3;
  list_head *plVar4;
  list_head *plVar5;
  long lVar6;
  long lVar7;
  JSValue v;
  JSValue v_00;
  
  pJVar2 = ctx->rt;
  iVar1 = (ctx->header).ref_count;
  (ctx->header).ref_count = iVar1 + -1;
  if (1 < iVar1) {
    return;
  }
  js_free_modules(ctx,JS_FREE_MODULE_ALL);
  JS_FreeValue(ctx,ctx->global_obj);
  JS_FreeValue(ctx,ctx->global_var_obj);
  JS_FreeValue(ctx,ctx->throw_type_error);
  JS_FreeValue(ctx,ctx->eval_obj);
  JS_FreeValue(ctx,ctx->array_proto_values);
  for (lVar7 = 0xa0; lVar7 != 0x120; lVar7 = lVar7 + 0x10) {
    v.tag = *(int64_t *)((long)&(ctx->header).ref_count + lVar7);
    v.u.ptr = ((JSValueUnion *)((long)ctx + lVar7 + -8))->ptr;
    JS_FreeValue(ctx,v);
  }
  lVar7 = 8;
  for (lVar6 = 0; pJVar3 = ctx->class_proto, lVar6 < pJVar2->class_count; lVar6 = lVar6 + 1) {
    v_00.tag = *(int64_t *)((long)&pJVar3->u + lVar7);
    v_00.u.ptr = ((JSValueUnion *)((long)pJVar3 + lVar7 + -8))->ptr;
    JS_FreeValue(ctx,v_00);
    lVar7 = lVar7 + 0x10;
  }
  (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,pJVar3);
  JS_FreeValue(ctx,ctx->iterator_proto);
  JS_FreeValue(ctx,ctx->async_iterator_proto);
  JS_FreeValue(ctx,ctx->promise_ctor);
  JS_FreeValue(ctx,ctx->array_ctor);
  JS_FreeValue(ctx,ctx->regexp_ctor);
  JS_FreeValue(ctx,ctx->function_ctor);
  JS_FreeValue(ctx,ctx->function_proto);
  if (ctx->array_shape != (JSShape *)0x0) {
    js_free_shape(ctx->rt,ctx->array_shape);
  }
  plVar4 = (ctx->link).prev;
  plVar5 = (ctx->link).next;
  plVar4->next = plVar5;
  plVar5->prev = plVar4;
  (ctx->link).prev = (list_head *)0x0;
  (ctx->link).next = (list_head *)0x0;
  plVar4 = (ctx->header).link.prev;
  plVar5 = (ctx->header).link.next;
  plVar4->next = plVar5;
  plVar5->prev = plVar4;
  (ctx->header).link.prev = (list_head *)0x0;
  (ctx->header).link.next = (list_head *)0x0;
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,ctx);
  return;
}

Assistant:

void JS_FreeContext(JSContext *ctx)
{
    JSRuntime *rt = ctx->rt;
    int i;

    if (--ctx->header.ref_count > 0)
        return;
    assert(ctx->header.ref_count == 0);
    
#ifdef DUMP_ATOMS
    JS_DumpAtoms(ctx->rt);
#endif
#ifdef DUMP_SHAPES
    JS_DumpShapes(ctx->rt);
#endif
#ifdef DUMP_OBJECTS
    {
        struct list_head *el;
        JSGCObjectHeader *p;
        printf("JSObjects: {\n");
        JS_DumpObjectHeader(ctx->rt);
        list_for_each(el, &rt->gc_obj_list) {
            p = list_entry(el, JSGCObjectHeader, link);
            JS_DumpGCObject(rt, p);
        }
        printf("}\n");
    }
#endif
#ifdef DUMP_MEM
    {
        JSMemoryUsage stats;
        JS_ComputeMemoryUsage(rt, &stats);
        JS_DumpMemoryUsage(stdout, &stats, rt);
    }
#endif

    js_free_modules(ctx, JS_FREE_MODULE_ALL);

    JS_FreeValue(ctx, ctx->global_obj);
    JS_FreeValue(ctx, ctx->global_var_obj);

    JS_FreeValue(ctx, ctx->throw_type_error);
    JS_FreeValue(ctx, ctx->eval_obj);

    JS_FreeValue(ctx, ctx->array_proto_values);
    for(i = 0; i < JS_NATIVE_ERROR_COUNT; i++) {
        JS_FreeValue(ctx, ctx->native_error_proto[i]);
    }
    for(i = 0; i < rt->class_count; i++) {
        JS_FreeValue(ctx, ctx->class_proto[i]);
    }
    js_free_rt(rt, ctx->class_proto);
    JS_FreeValue(ctx, ctx->iterator_proto);
    JS_FreeValue(ctx, ctx->async_iterator_proto);
    JS_FreeValue(ctx, ctx->promise_ctor);
    JS_FreeValue(ctx, ctx->array_ctor);
    JS_FreeValue(ctx, ctx->regexp_ctor);
    JS_FreeValue(ctx, ctx->function_ctor);
    JS_FreeValue(ctx, ctx->function_proto);

    js_free_shape_null(ctx->rt, ctx->array_shape);

    list_del(&ctx->link);
    remove_gc_object(&ctx->header);
    js_free_rt(ctx->rt, ctx);
}